

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int isoent_gen_iso9660_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  uint uVar1;
  void *pvVar2;
  isofile *piVar3;
  byte bVar4;
  int iVar5;
  byte *__dest;
  uint uVar6;
  int iVar7;
  byte *__s;
  char *pcVar8;
  size_t sVar9;
  byte *pbVar10;
  int iVar11;
  ulong uVar12;
  isoent *piVar13;
  uint weight;
  byte *pbVar14;
  byte *pbVar15;
  bool bVar16;
  archive_rb_tree_ops *in_stack_ffffffffffffff68;
  uint local_8c;
  ulong local_88;
  ulong local_78;
  
  iVar7 = (isoent->children).cnt;
  iVar5 = 0;
  if (iVar7 != 0) {
    pvVar2 = a->format_data;
    uVar1 = *(uint *)((long)pvVar2 + 0x10370);
    uVar6 = uVar1 >> 0xe & 7;
    if (uVar6 < 4) {
      local_78 = 0x1e;
      if (uVar6 == 1) {
        local_78 = 8;
      }
      local_8c = 0x1f;
      local_88 = 0xc;
      if (uVar6 != 1) {
        local_88 = 0x1f;
      }
      else {
        local_8c = 8;
      }
      bVar16 = (uVar1 & 4) == 0;
    }
    else {
      local_88 = 0xc1;
      if ((uVar1 & 0x1800000) == 0) {
        local_88 = 0xcf;
      }
      bVar16 = true;
      local_8c = (uint)local_88;
      local_78 = local_88;
    }
    iVar5 = idr_start(a,idr,iVar7,3,1,0x185d90,in_stack_ffffffffffffff68);
    if (-1 < iVar5) {
      piVar13 = (isoent->children).first;
      if (piVar13 != (isoent *)0x0) {
        uVar1 = (uint)local_78;
        iVar7 = (int)local_88;
        do {
          piVar3 = piVar13->file;
          uVar12 = (piVar3->basename).length;
          __dest = (byte *)malloc((long)((uVar12 << 0x20) + 0x2200000000) >> 0x20);
          if (__dest == (byte *)0x0) {
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
            return -0x1e;
          }
          sVar9 = (long)(uVar12 << 0x20) >> 0x20;
          memcpy(__dest,(piVar3->basename).s,sVar9);
          __dest[sVar9] = 0;
          piVar13->identifier = (char *)__dest;
          if (uVar6 < 4) {
            bVar4 = *__dest;
            if (bVar4 == 0x2e) {
              *__dest = 0x5f;
              __dest = __dest + 1;
              goto LAB_001576dd;
            }
          }
          else {
LAB_001576dd:
            bVar4 = *__dest;
          }
          iVar5 = (int)uVar12;
          if (bVar4 == 0) {
            pcVar8 = piVar13->identifier;
LAB_001577ae:
            weight = local_8c;
            if ((piVar13->field_0xe8 & 2) == 0) {
              weight = uVar1;
            }
            if ((int)weight < iVar5) {
              pcVar8[weight] = '\0';
LAB_001577d3:
              uVar12 = (ulong)weight;
            }
            else {
              uVar12 = uVar12 & 0xffffffff;
              weight = 0xffffffff;
            }
          }
          else {
            pbVar10 = (byte *)0x0;
            pbVar14 = (byte *)0x0;
            do {
              __s = pbVar10;
              if ((char)bVar4 < '\0') {
LAB_00157738:
                *__dest = 0x5f;
                pbVar15 = pbVar14;
              }
              else {
                pbVar15 = pbVar14;
                if (idr->char_map[bVar4] == '\0') {
                  if ((byte)(bVar4 + 0x9f) < 0x1a) {
                    *__dest = bVar4 - 0x20;
                  }
                  else if ((uVar6 < 4) || (__s = __dest, pbVar15 = pbVar10, bVar4 != 0x2e)) {
                    __s = pbVar10;
                    if (bVar4 == 0x2e) {
                      __s = __dest;
                      pbVar14 = pbVar10;
                    }
                    goto LAB_00157738;
                  }
                }
                else if (bVar4 == 0x2e) {
                  __s = __dest;
                  pbVar15 = pbVar10;
                }
              }
              bVar4 = __dest[1];
              __dest = __dest + 1;
              pbVar10 = __s;
              pbVar14 = pbVar15;
            } while (bVar4 != 0);
            pcVar8 = piVar13->identifier;
            if (__s == (byte *)0x0) goto LAB_001577ae;
            *__s = 0x2e;
            uVar12 = (long)__s - (long)pcVar8;
            if ((*(uint *)((long)pvVar2 + 0x10370) & 0x1c000) != 0x4000) {
              if ((piVar13->field_0xe8 & 2) != 0) {
                weight = 0xffffffff;
                if ((int)local_8c < iVar5) {
                  pcVar8[local_8c] = '\0';
                  iVar5 = (int)uVar12;
                  uVar12 = uVar12 & 0xffffffff;
                  weight = local_8c;
                  if ((int)local_8c < iVar5) {
                    uVar12 = (ulong)local_8c;
                  }
                }
                goto LAB_001578da;
              }
              if (iVar5 <= iVar7) {
                weight = 0xffffffff;
                goto LAB_001578da;
              }
              sVar9 = strlen((char *)__s);
              iVar5 = (int)pbVar15 - (int)pcVar8;
              if (pbVar15 == (byte *)0x0) {
                iVar5 = 0;
              }
              iVar11 = (int)sVar9;
              if ((iVar11 < 2) || ((int)(uVar1 - 1) <= iVar5)) {
                pcVar8[local_78] = '\0';
                uVar12 = local_78;
                weight = uVar1;
                goto LAB_001578da;
              }
              iVar5 = iVar11;
              if (iVar7 < iVar11) {
                iVar5 = iVar7;
              }
              weight = iVar7 - iVar5;
              if (iVar7 <= iVar11) {
                weight = 1;
              }
              memmove(pcVar8 + (int)weight,__s,(ulong)(iVar5 - (uint)(iVar7 <= iVar11)));
              pcVar8[local_88] = '\0';
              goto LAB_001577d3;
            }
            if ((long)uVar12 < 9) {
              sVar9 = strlen((char *)__s);
              weight = 0xffffffff;
              if (4 < sVar9) {
                __s[4] = 0;
                weight = 0;
              }
            }
            else {
              pcVar8[8] = '.';
              pcVar8[9] = __s[1];
              pcVar8[10] = __s[2];
              pcVar8[0xb] = __s[3];
              pcVar8[0xc] = '\0';
              uVar12 = 8;
              weight = 8;
            }
          }
LAB_001578da:
          iVar11 = (int)uVar12;
          piVar13->ext_off = iVar11;
          sVar9 = strlen(pcVar8 + iVar11);
          piVar13->ext_len = (int)sVar9;
          iVar5 = (int)sVar9 + iVar11;
          piVar13->id_len = iVar5;
          if ((*(uint *)((long)pvVar2 + 0x10370) & 0x1c000) == 0x4000) {
            if (4 < iVar11) {
              iVar11 = 5;
            }
          }
          else if (iVar5 == iVar7) {
            iVar11 = iVar11 + -3;
          }
          else if (iVar5 == iVar7 + -1) {
            iVar11 = iVar11 + -2;
          }
          else {
            iVar11 = iVar11 - (uint)(iVar5 == iVar7 + -2);
          }
          idr_register(idr,piVar13,weight,iVar11);
          piVar13 = piVar13->chnext;
        } while (piVar13 != (isoent *)0x0);
      }
      idr_resolve(idr,idr_set_num);
      iVar5 = 0;
      for (piVar13 = (isoent->children).first; piVar13 != (isoent *)0x0; piVar13 = piVar13->chnext)
      {
        if (((piVar13->field_0xe8 & 2) == 0) && (piVar13->rr_child == (isoent *)0x0)) {
          iVar7 = piVar13->ext_len;
          pcVar8 = piVar13->identifier + (long)iVar7 + (long)piVar13->ext_off;
          if ((uVar6 < 4) && (iVar7 == 0)) {
            *pcVar8 = '.';
            pcVar8 = pcVar8 + 1;
            iVar7 = 1;
LAB_00157a07:
            piVar13->ext_len = iVar7;
          }
          else if ((3 < uVar6) && (iVar7 == 1)) {
            pcVar8[-1] = '\0';
            pcVar8 = pcVar8 + -1;
            iVar7 = 0;
            goto LAB_00157a07;
          }
          piVar13->id_len = iVar7 + piVar13->ext_off;
          if (!bVar16) {
            pcVar8[0] = ';';
            pcVar8[1] = '1';
            pcVar8 = pcVar8 + 2;
            piVar13->id_len = piVar13->id_len + 2;
          }
          *pcVar8 = '\0';
          iVar7 = piVar13->id_len;
        }
        else {
          iVar7 = piVar13->ext_len + piVar13->ext_off;
          piVar13->id_len = iVar7;
        }
        piVar13->mb_len = iVar7;
      }
    }
  }
  return iVar5;
}

Assistant:

static int
isoent_gen_iso9660_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	char *p;
	int l, r;
	const char *char_map;
	char allow_ldots, allow_multidot, allow_period, allow_vernum;
	int fnmax, ffmax, dnmax;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_iso9660, isoent_cmp_key_iso9660
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	char_map = idr->char_map;
	if (iso9660->opt.iso_level <= 3) {
		allow_ldots = 0;
		allow_multidot = 0;
		allow_period = 1;
		allow_vernum = iso9660->opt.allow_vernum;
		if (iso9660->opt.iso_level == 1) {
			fnmax = 8;
			ffmax = 12;/* fnmax + '.' + 3 */
			dnmax = 8;
		} else {
			fnmax = 30;
			ffmax = 31;
			dnmax = 31;
		}
	} else {
		allow_ldots = allow_multidot = 1;
		allow_period = allow_vernum = 0;
		if (iso9660->opt.rr)
			/*
			 * MDR : The maximum size of Directory Record(254).
			 * DRL : A Directory Record Length(33).
			 * CE  : A size of SUSP CE System Use Entry(28).
			 * MDR - DRL - CE = 254 - 33 - 28 = 193.
			 */
			fnmax = ffmax = dnmax = 193;
		else
			/*
			 * XA  : CD-ROM XA System Use Extension
			 *       Information(14).
			 * MDR - DRL - XA = 254 - 33 -14 = 207.
			 */
			fnmax = ffmax = dnmax = 207;
	}

	r = idr_start(a, idr, isoent->children.cnt, ffmax, 3, 1, &rb_ops);
	if (r < 0)
		return (r);

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		char *dot, *xdot;
		int ext_off, noff, weight;

		l = (int)np->file->basename.length;
		p = malloc(l+31+2+1);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename.s, l);
		p[l] = '\0';
		np->identifier = p;

		dot = xdot = NULL;
		if (!allow_ldots) {
			/*
			 * If there is a '.' character at the first byte,
			 * it has to be replaced by '_' character.
			 */
			if (*p == '.')
				*p++ = '_';
		}
		for (;*p; p++) {
			if (*p & 0x80) {
				*p = '_';
				continue;
			}
			if (char_map[(unsigned char)*p]) {
				/* if iso-level is '4', a character '.' is
				 * allowed by char_map. */
				if (*p == '.') {
					xdot = dot;
					dot = p;
				}
				continue;
			}
			if (*p >= 'a' && *p <= 'z') {
				*p -= 'a' - 'A';
				continue;
			}
			if (*p == '.') {
				xdot = dot;
				dot = p;
				if (allow_multidot)
					continue;
			}
			*p = '_';
		}
		p = np->identifier;
		weight = -1;
		if (dot == NULL) {
			int nammax;

			if (np->dir)
				nammax = dnmax;
			else
				nammax = fnmax;

			if (l > nammax) {
				p[nammax] = '\0';
				weight = nammax;
				ext_off = nammax;
			} else
				ext_off = l;
		} else {
			*dot = '.';
			ext_off = (int)(dot - p);

			if (iso9660->opt.iso_level == 1) {
				if (dot - p <= 8) {
					if (strlen(dot) > 4) {
						/* A length of a file extension
						 * must be less than 4 */
						dot[4] = '\0';
						weight = 0;
					}
				} else {
					p[8] = dot[0];
					p[9] = dot[1];
					p[10] = dot[2];
					p[11] = dot[3];
					p[12] = '\0';
					weight = 8;
					ext_off = 8;
				}
			} else if (np->dir) {
				if (l > dnmax) {
					p[dnmax] = '\0';
					weight = dnmax;
					if (ext_off > dnmax)
						ext_off = dnmax;
				}
			} else if (l > ffmax) {
				int extlen = (int)strlen(dot);
				int xdoff;

				if (xdot != NULL)
					xdoff = (int)(xdot - p);
				else
					xdoff = 0;

				if (extlen > 1 && xdoff < fnmax-1) {
					int off;

					if (extlen > ffmax)
						extlen = ffmax;
					off = ffmax - extlen;
					if (off == 0) {
						/* A dot('.')  character
						 * does't place to the first
						 * byte of identifier. */
						off ++;
						extlen --;
					}
					memmove(p+off, dot, extlen);
					p[ffmax] = '\0';
					ext_off = off;
					weight = off;
#ifdef COMPAT_MKISOFS
				} else if (xdoff >= fnmax-1) {
					/* Simulate a bug(?) of mkisofs. */
					p[fnmax-1] = '\0';
					ext_off = fnmax-1;
					weight = fnmax-1;
#endif
				} else {
					p[fnmax] = '\0';
					ext_off = fnmax;
					weight = fnmax;
				}
			}
		}
		/* Save an offset of a file name extension to sort files. */
		np->ext_off = ext_off;
		np->ext_len = (int)strlen(&p[ext_off]);
		np->id_len = l = ext_off + np->ext_len;

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identififier. */
		if (iso9660->opt.iso_level == 1) {
			if (ext_off >= 5)
				noff = 5;
			else
				noff = ext_off;
		} else {
			if (l == ffmax)
				noff = ext_off - 3;
			else if (l == ffmax-1)
				noff = ext_off - 2;
			else if (l == ffmax-2)
				noff = ext_off - 1;
			else
				noff = ext_off;
		}
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier. */
	idr_resolve(idr, idr_set_num);

	/* Add a period and a version number to identifiers. */
	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		if (!np->dir && np->rr_child == NULL) {
			p = np->identifier + np->ext_off + np->ext_len;
			if (np->ext_len == 0 && allow_period) {
				*p++ = '.';
				np->ext_len = 1;
			}
			if (np->ext_len == 1 && !allow_period) {
				*--p = '\0';
				np->ext_len = 0;
			}
			np->id_len = np->ext_off + np->ext_len;
			if (allow_vernum) {
				*p++ = ';';
				*p++ = '1';
				np->id_len += 2;
			}
			*p = '\0';
		} else
			np->id_len = np->ext_off + np->ext_len;
		np->mb_len = np->id_len;
	}
	return (ARCHIVE_OK);
}